

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O1

void __thiscall
duckdb::BoxRenderer::Render
          (BoxRenderer *this,ClientContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,ColumnDataCollection *result,BaseResultRenderer *ss)

{
  value_type vVar1;
  bool bVar2;
  pointer puVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  long *plVar9;
  reference pvVar10;
  InternalException *this_00;
  ulong bottom_rows;
  size_type *psVar11;
  ulong uVar12;
  pointer puVar13;
  ulong uVar14;
  size_type __n;
  ulong uVar15;
  idx_t iVar16;
  LogicalType *this_01;
  bool bVar17;
  size_type sVar18;
  char cVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  ulong uVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_count_str;
  string __str_2;
  string shown_str;
  bool local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> row_count_str;
  string __str_1;
  list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> collections;
  vector<duckdb::LogicalType,_true> result_types;
  vector<unsigned_long,_true> boundaries;
  vector<unsigned_long,_true> widths;
  char *local_f0;
  uint local_e8;
  char local_e0 [16];
  idx_t total_length;
  vector<unsigned_long,_true> column_map;
  _List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_> local_b0;
  ulong local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  string local_70;
  string local_50;
  
  if (((long)(result->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(result->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
      ((long)(names->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(names->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5) != 0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    row_count_str._M_dataplus._M_p = (pointer)&row_count_str.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&row_count_str,"Error in BoxRenderer::Render - unaligned columns and names"
               ,"");
    InternalException::InternalException(this_00,&row_count_str);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar8 = (this->config).max_width;
  if (uVar8 == 0) {
    iVar7 = isatty(1);
    if (iVar7 == 0) {
      uVar8 = 0x78;
    }
    else {
      ioctl(0,0x5413,&row_count_str);
      uVar8 = (ulong)row_count_str._M_dataplus._M_p._2_2_;
    }
  }
  local_98 = 0x50;
  if (0x50 < uVar8) {
    local_98 = uVar8;
  }
  uVar8 = result->count;
  uVar15 = (this->config).max_rows;
  uVar14 = uVar15;
  if (uVar8 < uVar15) {
    uVar14 = uVar8;
  }
  if (uVar8 <= uVar15 + 3) {
    uVar14 = uVar8;
  }
  bottom_rows = 0;
  uVar15 = uVar8;
  if (uVar14 != uVar8) {
    bottom_rows = uVar14 >> 1;
    uVar15 = uVar14 - (uVar14 >> 1);
  }
  cVar19 = '\x01';
  if (9 < uVar8) {
    uVar21 = uVar8;
    cVar6 = '\x04';
    do {
      cVar19 = cVar6;
      if (uVar21 < 100) {
        cVar19 = cVar19 + -2;
        goto LAB_00e600f1;
      }
      if (uVar21 < 1000) {
        cVar19 = cVar19 + -1;
        goto LAB_00e600f1;
      }
      if (uVar21 < 10000) goto LAB_00e600f1;
      bVar17 = 99999 < uVar21;
      uVar21 = uVar21 / 10000;
      cVar6 = cVar19 + '\x04';
    } while (bVar17);
    cVar19 = cVar19 + '\x01';
  }
LAB_00e600f1:
  paVar20 = &shown_str.field_2;
  shown_str._M_dataplus._M_p = (pointer)paVar20;
  local_90 = &names->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  ::std::__cxx11::string::_M_construct((ulong)&shown_str,cVar19);
  ::std::__detail::__to_chars_10_impl<unsigned_long>
            (shown_str._M_dataplus._M_p,(uint)shown_str._M_string_length,uVar8);
  plVar9 = (long *)::std::__cxx11::string::append((char *)&shown_str);
  row_count_str._M_dataplus._M_p = (pointer)&row_count_str.field_2;
  psVar11 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar11) {
    row_count_str.field_2._M_allocated_capacity = *psVar11;
    row_count_str.field_2._8_8_ = plVar9[3];
  }
  else {
    row_count_str.field_2._M_allocated_capacity = *psVar11;
    row_count_str._M_dataplus._M_p = (pointer)*plVar9;
  }
  row_count_str._M_string_length = plVar9[1];
  *plVar9 = (long)psVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shown_str._M_dataplus._M_p != paVar20) {
    operator_delete(shown_str._M_dataplus._M_p);
  }
  uVar21 = (this->config).limit;
  if (uVar8 == uVar21 && uVar21 != 0) {
    ::std::__cxx11::string::_M_replace
              ((ulong)&row_count_str,0,(char *)row_count_str._M_string_length,0x1df6ef1);
  }
  shown_str._M_string_length = 0;
  shown_str.field_2._M_local_buf[0] = '\0';
  local_1b8 = uVar15 < uVar8;
  shown_str._M_dataplus._M_p = (pointer)paVar20;
  if (local_1b8) {
    ::std::__cxx11::string::_M_replace((ulong)&shown_str,0,(char *)0x0,0x1e4c92c);
    if (uVar8 == uVar21 && uVar21 != 0) {
      uVar21 = (this->config).limit - 1;
      cVar19 = '\x01';
      if (9 < uVar21) {
        uVar12 = uVar21;
        cVar6 = '\x04';
        do {
          cVar19 = cVar6;
          if (uVar12 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_00e60268;
          }
          if (uVar12 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_00e60268;
          }
          if (uVar12 < 10000) goto LAB_00e60268;
          bVar17 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar6 = cVar19 + '\x04';
        } while (bVar17);
        cVar19 = cVar19 + '\x01';
      }
LAB_00e60268:
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar19);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar21);
      plVar9 = (long *)::std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,0x1e4067e);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar11) {
        __str_2.field_2._M_allocated_capacity = *psVar11;
        __str_2.field_2._8_8_ = plVar9[3];
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
      }
      else {
        __str_2.field_2._M_allocated_capacity = *psVar11;
        __str_2._M_dataplus._M_p = (pointer)*plVar9;
      }
      __str_2._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)::std::__cxx11::string::append((char *)&__str_2);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar11) {
        column_count_str.field_2._M_allocated_capacity = *psVar11;
        column_count_str.field_2._8_8_ = plVar9[3];
        column_count_str._M_dataplus._M_p = (pointer)&column_count_str.field_2;
      }
      else {
        column_count_str.field_2._M_allocated_capacity = *psVar11;
        column_count_str._M_dataplus._M_p = (pointer)*plVar9;
      }
      column_count_str._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&shown_str,(ulong)column_count_str._M_dataplus._M_p)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)column_count_str._M_dataplus._M_p != &column_count_str.field_2) {
        operator_delete(column_count_str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p);
      }
    }
    cVar19 = '\x01';
    if (9 < uVar14) {
      uVar21 = uVar14;
      cVar6 = '\x04';
      do {
        cVar19 = cVar6;
        if (uVar21 < 100) {
          cVar19 = cVar19 + -2;
          goto LAB_00e603f6;
        }
        if (uVar21 < 1000) {
          cVar19 = cVar19 + -1;
          goto LAB_00e603f6;
        }
        if (uVar21 < 10000) goto LAB_00e603f6;
        bVar17 = 99999 < uVar21;
        uVar21 = uVar21 / 10000;
        cVar6 = cVar19 + '\x04';
      } while (bVar17);
      cVar19 = cVar19 + '\x01';
    }
LAB_00e603f6:
    __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&__str_2,cVar19);
    ::std::__detail::__to_chars_10_impl<unsigned_long>
              (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,uVar14);
    plVar9 = (long *)::std::__cxx11::string::append((char *)&__str_2);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar11) {
      column_count_str.field_2._M_allocated_capacity = *psVar11;
      column_count_str.field_2._8_8_ = plVar9[3];
      column_count_str._M_dataplus._M_p = (pointer)&column_count_str.field_2;
    }
    else {
      column_count_str.field_2._M_allocated_capacity = *psVar11;
      column_count_str._M_dataplus._M_p = (pointer)*plVar9;
    }
    column_count_str._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&shown_str,(ulong)column_count_str._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)column_count_str._M_dataplus._M_p != &column_count_str.field_2) {
      operator_delete(column_count_str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
      operator_delete(__str_2._M_dataplus._M_p);
    }
  }
  sVar18 = shown_str._M_string_length;
  if (shown_str._M_string_length < row_count_str._M_string_length) {
    sVar18 = row_count_str._M_string_length;
  }
  FetchRenderCollections_abi_cxx11_(&collections,this,context,result,uVar15,bottom_rows);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&column_names,local_90);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&result_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &(result->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  if ((this->config).render_mode == COLUMNS) {
    local_b0._M_impl._M_node.super__List_node_base._M_next =
         collections.
         super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    local_b0._M_impl._M_node.super__List_node_base._M_prev =
         collections.
         super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
         ._M_impl._M_node.super__List_node_base._M_prev;
    local_b0._M_impl._M_node._M_size =
         collections.
         super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
         ._M_impl._M_node._M_size;
    p_Var4 = (_List_node_base *)&local_b0;
    p_Var5 = (_List_node_base *)&local_b0;
    if (collections.
        super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&collections) {
      (collections.
       super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
       ._M_impl._M_node.super__List_node_base._M_prev)->_M_next = (_List_node_base *)&local_b0;
      (collections.
       super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
       ._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)&local_b0;
      collections.
      super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>.
      _M_impl._M_node._M_size = 0;
      collections.
      super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&collections;
      collections.
      super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&collections;
      p_Var4 = local_b0._M_impl._M_node.super__List_node_base._M_next;
      p_Var5 = local_b0._M_impl._M_node.super__List_node_base._M_prev;
    }
    local_b0._M_impl._M_node.super__List_node_base._M_prev = p_Var5;
    local_b0._M_impl._M_node.super__List_node_base._M_next = p_Var4;
    PivotCollections((list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
                      *)&column_count_str,this,context,
                     (list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
                      *)&local_b0,&column_names,&result_types,uVar8);
    std::__cxx11::list<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
    ::_M_move_assign(&collections,&column_count_str);
    std::__cxx11::
    _List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>::
    _M_clear((_List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
              *)&column_count_str);
    std::__cxx11::
    _List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>::
    _M_clear(&local_b0);
  }
  iVar16 = sVar18 + 4;
  if (uVar8 - 1 < uVar15) {
    iVar16 = 0;
  }
  column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ComputeRenderWidths(&widths,this,&column_names,&result_types,&collections,iVar16,local_98,
                      &column_map,&total_length);
  boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      if (__n == 0) {
        pvVar10 = vector<unsigned_long,_true>::operator[](&widths,0);
        column_count_str._M_dataplus._M_p = (pointer)(*pvVar10 + 2);
      }
      else {
        pvVar10 = vector<unsigned_long,_true>::operator[](&boundaries,__n - 1);
        vVar1 = *pvVar10;
        pvVar10 = vector<unsigned_long,_true>::operator[](&widths,__n);
        column_count_str._M_dataplus._M_p = (pointer)(*pvVar10 + vVar1 + 3);
      }
      if (boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&boundaries,
                   (iterator)
                   boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(unsigned_long *)&column_count_str);
      }
      else {
        *boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)column_count_str._M_dataplus._M_p;
        boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  RenderHeader(this,&column_names,&result_types,&column_map,&widths,&boundaries,total_length,
               uVar8 != 0,ss);
  RenderValues(this,&collections,&column_map,&widths,&result_types,ss);
  uVar15 = ((long)(result->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(result->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  cVar19 = '\x01';
  if (9 < uVar15) {
    uVar14 = uVar15;
    cVar6 = '\x04';
    do {
      cVar19 = cVar6;
      if (uVar14 < 100) {
        cVar19 = cVar19 + -2;
        goto LAB_00e6082f;
      }
      if (uVar14 < 1000) {
        cVar19 = cVar19 + -1;
        goto LAB_00e6082f;
      }
      if (uVar14 < 10000) goto LAB_00e6082f;
      bVar17 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar6 = cVar19 + '\x04';
    } while (bVar17);
    cVar19 = cVar19 + '\x01';
  }
LAB_00e6082f:
  paVar20 = &__str_2.field_2;
  __str_2._M_dataplus._M_p = (pointer)paVar20;
  ::std::__cxx11::string::_M_construct((ulong)&__str_2,cVar19);
  ::std::__detail::__to_chars_10_impl<unsigned_long>
            (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,uVar15);
  plVar9 = (long *)::std::__cxx11::string::append((char *)&__str_2);
  column_count_str._M_dataplus._M_p = (pointer)&column_count_str.field_2;
  psVar11 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar11) {
    column_count_str.field_2._M_allocated_capacity = *psVar11;
    column_count_str.field_2._8_8_ = plVar9[3];
  }
  else {
    column_count_str.field_2._M_allocated_capacity = *psVar11;
    column_count_str._M_dataplus._M_p = (pointer)*plVar9;
  }
  column_count_str._M_string_length = plVar9[1];
  *plVar9 = (long)psVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar20) {
    operator_delete(__str_2._M_dataplus._M_p);
  }
  if (1 < (ulong)(((long)(result->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(result->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    ::std::__cxx11::string::append((char *)&column_count_str);
  }
  puVar3 = column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar17 = false;
  }
  else {
    do {
      puVar13 = puVar3 + 1;
      bVar17 = false;
      if (*puVar3 == 0xffffffffffffffff) {
        bVar17 = true;
        break;
      }
      puVar3 = puVar13;
    } while (puVar13 !=
             column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  iVar16 = (long)column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  if ((this->config).render_mode == COLUMNS) {
    if (bVar17) {
      uVar15 = iVar16 - 3;
      cVar19 = '\x01';
      if (9 < uVar15) {
        uVar14 = uVar15;
        cVar6 = '\x04';
        do {
          cVar19 = cVar6;
          if (uVar14 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_00e60a64;
          }
          if (uVar14 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_00e60a64;
          }
          if (uVar14 < 10000) goto LAB_00e60a64;
          bVar2 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          cVar6 = cVar19 + '\x04';
        } while (bVar2);
        cVar19 = cVar19 + '\x01';
      }
LAB_00e60a64:
      local_f0 = local_e0;
      ::std::__cxx11::string::_M_construct((ulong)&local_f0,cVar19);
      ::std::__detail::__to_chars_10_impl<unsigned_long>(local_f0,local_e8,uVar15);
      plVar9 = (long *)::std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1e4c92b);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar11) {
        __str_1.field_2._M_allocated_capacity = *psVar11;
        __str_1.field_2._8_8_ = plVar9[3];
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      }
      else {
        __str_1.field_2._M_allocated_capacity = *psVar11;
        __str_1._M_dataplus._M_p = (pointer)*plVar9;
      }
      __str_1._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)::std::__cxx11::string::append((char *)&__str_1);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar11) {
        __str_2.field_2._M_allocated_capacity = *psVar11;
        __str_2.field_2._8_8_ = plVar9[3];
        __str_2._M_dataplus._M_p = (pointer)paVar20;
      }
      else {
        __str_2.field_2._M_allocated_capacity = *psVar11;
        __str_2._M_dataplus._M_p = (pointer)*plVar9;
      }
      __str_2._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)&shown_str,(string *)&__str_2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != paVar20) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0);
      }
      local_1b8 = true;
    }
    else {
      __str_2._M_string_length = 0;
      __str_2.field_2._M_allocated_capacity =
           __str_2.field_2._M_allocated_capacity & 0xffffffffffffff00;
      __str_2._M_dataplus._M_p = (pointer)paVar20;
      ::std::__cxx11::string::operator=((string *)&shown_str,(string *)&__str_2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != paVar20) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
    }
  }
  else if (bVar17 != false) {
    iVar16 = iVar16 - 1;
    cVar19 = '\x01';
    if (9 < iVar16) {
      uVar15 = iVar16;
      cVar6 = '\x04';
      do {
        cVar19 = cVar6;
        if (uVar15 < 100) {
          cVar19 = cVar19 + -2;
          goto LAB_00e60bbd;
        }
        if (uVar15 < 1000) {
          cVar19 = cVar19 + -1;
          goto LAB_00e60bbd;
        }
        if (uVar15 < 10000) goto LAB_00e60bbd;
        bVar2 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar6 = cVar19 + '\x04';
      } while (bVar2);
      cVar19 = cVar19 + '\x01';
    }
LAB_00e60bbd:
    local_f0 = local_e0;
    ::std::__cxx11::string::_M_construct((ulong)&local_f0,cVar19);
    ::std::__detail::__to_chars_10_impl<unsigned_long>(local_f0,local_e8,iVar16);
    plVar9 = (long *)::std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1e4c92b);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar11) {
      __str_1.field_2._M_allocated_capacity = *psVar11;
      __str_1.field_2._8_8_ = plVar9[3];
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
    }
    else {
      __str_1.field_2._M_allocated_capacity = *psVar11;
      __str_1._M_dataplus._M_p = (pointer)*plVar9;
    }
    __str_1._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)::std::__cxx11::string::append((char *)&__str_1);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar11) {
      __str_2.field_2._M_allocated_capacity = *psVar11;
      __str_2.field_2._8_8_ = plVar9[3];
      __str_2._M_dataplus._M_p = (pointer)paVar20;
    }
    else {
      __str_2.field_2._M_allocated_capacity = *psVar11;
      __str_2._M_dataplus._M_p = (pointer)*plVar9;
    }
    __str_2._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&column_count_str,(ulong)__str_2._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p != paVar20) {
      operator_delete(__str_2._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
      operator_delete(__str_1._M_dataplus._M_p);
    }
    if (local_f0 != local_e0) {
      operator_delete(local_f0);
    }
  }
  paVar20 = &shown_str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)row_count_str._M_dataplus._M_p == &row_count_str.field_2) {
    local_70.field_2._8_8_ = row_count_str.field_2._8_8_;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70._M_dataplus._M_p = row_count_str._M_dataplus._M_p;
  }
  local_70.field_2._M_allocated_capacity = row_count_str.field_2._M_allocated_capacity;
  local_70._M_string_length = row_count_str._M_string_length;
  row_count_str._M_string_length = 0;
  row_count_str.field_2._M_allocated_capacity =
       row_count_str.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shown_str._M_dataplus._M_p == paVar20) {
    local_50.field_2._8_8_ = shown_str.field_2._8_8_;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50._M_dataplus._M_p = shown_str._M_dataplus._M_p;
  }
  local_50.field_2._M_allocated_capacity._1_7_ = shown_str.field_2._M_allocated_capacity._1_7_;
  local_50.field_2._M_local_buf[0] = shown_str.field_2._M_local_buf[0];
  local_50._M_string_length = shown_str._M_string_length;
  shown_str._M_string_length = 0;
  shown_str.field_2._M_local_buf[0] = '\0';
  shown_str._M_dataplus._M_p = (pointer)paVar20;
  row_count_str._M_dataplus._M_p = (pointer)&row_count_str.field_2;
  RenderRowCount(this,&local_70,&local_50,&column_count_str,&boundaries,local_1b8,bVar17,
                 total_length,uVar8,iVar16,sVar18 + 4,ss);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)column_count_str._M_dataplus._M_p != &column_count_str.field_2) {
    operator_delete(column_count_str._M_dataplus._M_p);
  }
  if (boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(boundaries.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(widths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  this_01 = result_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(column_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
    this_01 = result_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  for (; this_01 !=
         result_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    LogicalType::~LogicalType(this_01);
  }
  if (result_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(result_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&column_names);
  std::__cxx11::
  _List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>::_M_clear
            (&collections.
              super__List_base<duckdb::ColumnDataCollection,_std::allocator<duckdb::ColumnDataCollection>_>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shown_str._M_dataplus._M_p != paVar20) {
    operator_delete(shown_str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)row_count_str._M_dataplus._M_p != &row_count_str.field_2) {
    operator_delete(row_count_str._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BoxRenderer::Render(ClientContext &context, const vector<string> &names, const ColumnDataCollection &result,
                         BaseResultRenderer &ss) {
	if (result.ColumnCount() != names.size()) {
		throw InternalException("Error in BoxRenderer::Render - unaligned columns and names");
	}
	auto max_width = config.max_width;
	if (max_width == 0) {
		if (Printer::IsTerminal(OutputStream::STREAM_STDOUT)) {
			max_width = Printer::TerminalWidth();
		} else {
			max_width = 120;
		}
	}
	// we do not support max widths under 80
	max_width = MaxValue<idx_t>(80, max_width);

	// figure out how many/which rows to render
	idx_t row_count = result.Count();
	idx_t rows_to_render = MinValue<idx_t>(row_count, config.max_rows);
	if (row_count <= config.max_rows + 3) {
		// hiding rows adds 3 extra rows
		// so hiding rows makes no sense if we are only slightly over the limit
		// if we are 1 row over the limit hiding rows will actually increase the number of lines we display!
		// in this case render all the rows
		rows_to_render = row_count;
	}
	idx_t top_rows;
	idx_t bottom_rows;
	if (rows_to_render == row_count) {
		top_rows = row_count;
		bottom_rows = 0;
	} else {
		top_rows = rows_to_render / 2 + (rows_to_render % 2 != 0 ? 1 : 0);
		bottom_rows = rows_to_render - top_rows;
	}
	auto row_count_str = to_string(row_count) + " rows";
	bool has_limited_rows = config.limit > 0 && row_count == config.limit;
	if (has_limited_rows) {
		row_count_str = "? rows";
	}
	string shown_str;
	bool has_hidden_rows = top_rows < row_count;
	if (has_hidden_rows) {
		shown_str = "(";
		if (has_limited_rows) {
			shown_str += ">" + to_string(config.limit - 1) + " rows, ";
		}
		shown_str += to_string(top_rows + bottom_rows) + " shown)";
	}
	auto minimum_row_length = MaxValue<idx_t>(row_count_str.size(), shown_str.size()) + 4;

	// fetch the top and bottom render collections from the result
	auto collections = FetchRenderCollections(context, result, top_rows, bottom_rows);
	auto column_names = names;
	auto result_types = result.Types();
	if (config.render_mode == RenderMode::COLUMNS) {
		collections = PivotCollections(context, std::move(collections), column_names, result_types, row_count);
	}

	// for each column, figure out the width
	// start off by figuring out the name of the header by looking at the column name and column type
	idx_t min_width = has_hidden_rows || row_count == 0 ? minimum_row_length : 0;
	vector<idx_t> column_map;
	idx_t total_length;
	auto widths =
	    ComputeRenderWidths(column_names, result_types, collections, min_width, max_width, column_map, total_length);

	// render boundaries for the individual columns
	vector<idx_t> boundaries;
	for (idx_t c = 0; c < widths.size(); c++) {
		idx_t render_boundary;
		if (c == 0) {
			render_boundary = widths[c] + 2;
		} else {
			render_boundary = boundaries[c - 1] + widths[c] + 3;
		}
		boundaries.push_back(render_boundary);
	}

	// now begin rendering
	// first render the header
	RenderHeader(column_names, result_types, column_map, widths, boundaries, total_length, row_count > 0, ss);

	// render the values, if there are any
	RenderValues(collections, column_map, widths, result_types, ss);

	// render the row count and column count
	auto column_count_str = to_string(result.ColumnCount()) + " column";
	if (result.ColumnCount() > 1) {
		column_count_str += "s";
	}
	bool has_hidden_columns = false;
	for (auto entry : column_map) {
		if (entry == SPLIT_COLUMN) {
			has_hidden_columns = true;
			break;
		}
	}
	idx_t column_count = column_map.size();
	if (config.render_mode == RenderMode::COLUMNS) {
		if (has_hidden_columns) {
			has_hidden_rows = true;
			shown_str = " (" + to_string(column_count - 3) + " shown)";
		} else {
			shown_str = string();
		}
	} else {
		if (has_hidden_columns) {
			column_count--;
			column_count_str += " (" + to_string(column_count) + " shown)";
		}
	}

	RenderRowCount(std::move(row_count_str), std::move(shown_str), column_count_str, boundaries, has_hidden_rows,
	               has_hidden_columns, total_length, row_count, column_count, minimum_row_length, ss);
}